

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O2

_Bool xor16_allocate(uint32_t size,xor16_t *filter)

{
  uint16_t *puVar1;
  ulong uVar2;
  double dVar3;
  
  dVar3 = (double)size * 1.23 + 32.0;
  uVar2 = (ulong)dVar3;
  uVar2 = ((long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2) / 3;
  puVar1 = (uint16_t *)malloc(uVar2 * 6);
  filter->fingerprints = puVar1;
  if (puVar1 != (uint16_t *)0x0) {
    filter->blockLength = uVar2;
  }
  return SUB81(puVar1,0);
}

Assistant:

static inline bool xor16_allocate(uint32_t size, xor16_t *filter) {
  size_t capacity = (size_t)(32 + 1.23 * size);
  capacity = capacity / 3 * 3;
  filter->fingerprints = (uint16_t *)malloc(capacity * sizeof(uint16_t));
  if (filter->fingerprints != NULL) {
    filter->blockLength = capacity / 3;
    return true;
  } 
  return false;
}